

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O1

int GetTelemetersPololu(POLOLU *pPololu,double *pDist1,double *pDist2,double *pDist3,double *pDist4,
                       double *pDist5,double *pDist6,double *pDist7,double *pDist8,double *pDist9,
                       double *pDist10,double *pDist11,double *pDist12)

{
  int iVar1;
  int iVar2;
  int selectedchannels [24];
  int local_f8 [50];
  
  local_f8[0x18] = 0;
  local_f8[0x19] = 0;
  local_f8[0x1a] = 0;
  local_f8[0x1b] = 0;
  local_f8[0x1c] = 0;
  local_f8[0x1d] = 0;
  local_f8[0x1e] = 0;
  local_f8[0x1f] = 0;
  local_f8[0x20] = 0;
  local_f8[0x21] = 0;
  local_f8[0x22] = 0;
  local_f8[0x23] = 0;
  local_f8[0x24] = 0;
  local_f8[0x25] = 0;
  local_f8[0x26] = 0;
  local_f8[0x27] = 0;
  local_f8[0x28] = 0;
  local_f8[0x29] = 0;
  local_f8[0x2a] = 0;
  local_f8[0x2b] = 0;
  local_f8[0x2c] = 0;
  local_f8[0x2d] = 0;
  local_f8[0x2e] = 0;
  local_f8[0x2f] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_f8[4] = 0;
  local_f8[5] = 0;
  local_f8[6] = 0;
  local_f8[7] = 0;
  local_f8[8] = 0;
  local_f8[9] = 0;
  local_f8[10] = 0;
  local_f8[0xb] = 0;
  local_f8[0xc] = 0;
  local_f8[0xd] = 0;
  local_f8[0xe] = 0;
  local_f8[0xf] = 0;
  local_f8[0x10] = 0;
  local_f8[0x11] = 0;
  local_f8[0x12] = 0;
  local_f8[0x13] = 0;
  local_f8[0x14] = 0;
  local_f8[0x15] = 0;
  local_f8[0x16] = 0;
  local_f8[0x17] = 0;
  local_f8[(long)pPololu->telem1analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem2analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem3analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem4analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem5analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem6analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem7analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem8analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem9analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem10analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem11analoginputchan + 0x18] = 1;
  local_f8[(long)pPololu->telem12analoginputchan + 0x18] = 1;
  iVar2 = GetAllValuesPololu(pPololu,local_f8 + 0x18,local_f8);
  if (iVar2 == 0) {
    iVar1 = pPololu->telem1analoginputchan;
    *pDist1 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem2analoginputchan;
    *pDist2 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem3analoginputchan;
    *pDist3 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem4analoginputchan;
    *pDist4 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem5analoginputchan;
    *pDist5 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem6analoginputchan;
    *pDist6 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem7analoginputchan;
    *pDist7 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem8analoginputchan;
    *pDist8 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem9analoginputchan;
    *pDist9 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem10analoginputchan;
    *pDist10 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem11analoginputchan;
    *pDist11 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem12analoginputchan;
    *pDist12 = ((double)local_f8[iVar1] * pPololu->analoginputcoef[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
  }
  return (uint)(iVar2 != 0);
}

Assistant:

inline int GetTelemetersPololu(POLOLU* pPololu, double* pDist1, double* pDist2, double* pDist3, double* pDist4, double* pDist5, double* pDist6, double* pDist7, double* pDist8, double* pDist9, double* pDist10, double* pDist11, double* pDist12)
{
	int selectedchannels[NB_CHANNELS_AI_POLOLU];
	int ais[NB_CHANNELS_AI_POLOLU];
	int i = 0;

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(ais, 0, sizeof(ais));

	selectedchannels[pPololu->telem1analoginputchan] = 1;
	selectedchannels[pPololu->telem2analoginputchan] = 1;
	selectedchannels[pPololu->telem3analoginputchan] = 1;
	selectedchannels[pPololu->telem4analoginputchan] = 1;
	selectedchannels[pPololu->telem5analoginputchan] = 1;
	selectedchannels[pPololu->telem6analoginputchan] = 1;
	selectedchannels[pPololu->telem7analoginputchan] = 1;
	selectedchannels[pPololu->telem8analoginputchan] = 1;
	selectedchannels[pPololu->telem9analoginputchan] = 1;
	selectedchannels[pPololu->telem10analoginputchan] = 1;
	selectedchannels[pPololu->telem11analoginputchan] = 1;
	selectedchannels[pPololu->telem12analoginputchan] = 1;

	if (GetAllValuesPololu(pPololu, selectedchannels, ais) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	i = pPololu->telem1analoginputchan;
	*pDist1 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem2analoginputchan;
	*pDist2 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem3analoginputchan;
	*pDist3 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem4analoginputchan;
	*pDist4 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem5analoginputchan;
	*pDist5 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem6analoginputchan;
	*pDist6 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem7analoginputchan;
	*pDist7 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem8analoginputchan;
	*pDist8 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem9analoginputchan;
	*pDist9 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem10analoginputchan;
	*pDist10 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem11analoginputchan;
	*pDist11 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem12analoginputchan;
	*pDist12 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];

	return EXIT_SUCCESS;
}